

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

void __thiscall flatbuffers::CodeWriter::AppendIdent(CodeWriter *this,stringstream *stream)

{
  long lVar1;
  int local_1c;
  int lvl;
  stringstream *stream_local;
  CodeWriter *this_local;
  
  local_1c = this->cur_ident_lvl_;
  while (local_1c != 0) {
    lVar1 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write((char *)(stream + 0x10),lVar1);
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

void CodeWriter::AppendIdent(std::stringstream &stream) {
  int lvl = cur_ident_lvl_;
  while (lvl--) {
    stream.write(pad_.c_str(), static_cast<std::streamsize>(pad_.size()));
  }
}